

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression::CompressToBuffer
                 (int32_t *ints,size_t numInts,char *compressed,string *err)

{
  int iVar1;
  mapped_type *pmVar2;
  byte *pbVar3;
  char *input;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  bool bVar14;
  SInt val;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  int local_8c;
  string *local_88;
  ulong local_80;
  int *local_78;
  char *local_70;
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    input = (char *)operator_new__(0);
    sVar4 = LZ4Compression::CompressToBuffer(input,compressed,0,err);
    operator_delete__(input);
    return sVar4;
  }
  local_80 = numInts * 2 + 7 >> 3;
  local_88 = err;
  local_70 = compressed;
  local_78 = (int *)operator_new__(local_80 + numInts * 4 + 4);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar11 = 0;
  iVar1 = 0;
  uVar8 = 0;
  iVar10 = 0;
  do {
    local_8c = *(int *)((long)ints + lVar11) - iVar1;
    pmVar2 = ::std::__detail::
             _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_8c);
    uVar7 = *pmVar2 + 1;
    *pmVar2 = uVar7;
    bVar14 = uVar7 == uVar8;
    iVar13 = local_8c;
    if (((uVar7 <= uVar8) && (uVar7 = uVar8, iVar13 = iVar10, bVar14)) && (iVar10 < local_8c)) {
      iVar13 = local_8c;
    }
    iVar1 = *(int *)((long)ints + lVar11);
    lVar11 = lVar11 + 4;
    uVar8 = uVar7;
    iVar10 = iVar13;
  } while (numInts * 4 - lVar11 != 0);
  ::std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  *local_78 = iVar13;
  pbVar3 = (byte *)(local_78 + 1);
  piVar12 = (int *)((long)local_78 + local_80 + 4);
  if (3 < numInts) {
    iVar1 = 0;
    do {
      iVar6 = 0;
      bVar9 = 0;
      iVar10 = iVar1;
      do {
        iVar1 = *ints;
        iVar10 = iVar1 - iVar10;
        if (iVar10 != iVar13) {
          bVar5 = (byte)iVar6;
          if ((char)iVar10 == iVar10) {
            bVar5 = (byte)(1 << (bVar5 & 0x1f));
            *(char *)piVar12 = (char)iVar10;
            lVar11 = 1;
          }
          else if ((short)iVar10 == iVar10) {
            bVar5 = (byte)(2 << (bVar5 & 0x1f));
            *(short *)piVar12 = (short)iVar10;
            lVar11 = 2;
          }
          else {
            bVar5 = (byte)(3 << (bVar5 & 0x1f));
            *piVar12 = iVar10;
            lVar11 = 4;
          }
          piVar12 = (int *)((long)piVar12 + lVar11);
          bVar9 = bVar9 | bVar5;
        }
        ints = ints + 1;
        iVar6 = iVar6 + 2;
        iVar10 = iVar1;
      } while (iVar6 != 8);
      *pbVar3 = bVar9;
      pbVar3 = pbVar3 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar4 = (*(code *)(&DAT_003ada90 + *(int *)(&DAT_003ada90 + numInts * 4)))();
  return sVar4;
}

Assistant:

size_t
Usd_IntegerCompression::CompressToBuffer(
    int32_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}